

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezone.cpp
# Opt level: O1

QDataStream * operator>>(QDataStream *ds,QTimeZone *tz)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  QDataStream *pQVar4;
  Data DVar5;
  QTimeZonePrivate *pQVar6;
  qsizetype qVar7;
  long in_FS_OFFSET;
  bool bVar8;
  QStringView rhs;
  QLatin1StringView rhs_00;
  QLatin1StringView rhs_01;
  QLatin1StringView rhs_02;
  QLatin1StringView rhs_03;
  QStringView lhs;
  QStringView lhs_00;
  QStringView lhs_01;
  QStringView lhs_02;
  QStringView lhs_03;
  int territory;
  int utcOffset;
  int utcOffset_1;
  Data local_d8;
  Data local_d0;
  QByteArray local_c8;
  Data local_b0;
  QString local_a8;
  qint32 local_8c;
  Data local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  Data local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  qint32 local_4c;
  QString local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d.d = (Data *)0x0;
  local_48.d.ptr = (storage_type_conflict *)0x0;
  local_48.d.size = 0;
  operator>>(ds,&local_48);
  if ((local_48.d.size == 0x18) &&
     (rhs.m_data = L"-No Time Zone Specified!", rhs.m_size = 0x18, lhs.m_data = local_48.d.ptr,
     lhs.m_size = 0x18, bVar1 = QtPrivate::equalStrings(lhs,rhs), bVar1)) {
    QTimeZone::QTimeZone((QTimeZone *)&local_68.s);
    DVar5.s = *(ShortData *)&tz->d;
    tz->d = local_68;
    local_68.s = DVar5.s;
LAB_00359e3c:
    QTimeZone::~QTimeZone((QTimeZone *)&local_68.s);
    goto LAB_00359e41;
  }
  qVar7 = local_48.d.size;
  switch(local_48.d.size) {
  case 0xc:
switchD_00359bf6_caseD_c:
    rhs_00.m_data = "AheadOfUtcBy";
    rhs_00.m_size = 0xc;
    lhs_00.m_data = local_48.d.ptr;
    lhs_00.m_size = qVar7;
    bVar1 = QtPrivate::equalStrings(lhs_00,rhs_00);
    if (bVar1) {
      local_88._0_4_ = 0xaaaaaaaa;
      QDataStream::operator>>(ds,(qint32 *)&local_88);
      lVar3 = (long)(int)local_88._0_4_;
      pQVar6 = (QTimeZonePrivate *)0x0;
      if (lVar3 + 0xe100U < 0x1c201) {
        pQVar6 = (QTimeZonePrivate *)((3 - (ulong)(lVar3 == 0)) + lVar3 * 4);
      }
      local_68.s = *(ShortData *)&tz->d;
      (tz->d).d = pQVar6;
      goto LAB_00359e3c;
    }
    if (qVar7 == 0x14) goto switchD_00359bf6_caseD_14;
    if (qVar7 == 0xe) goto switchD_00359bf6_caseD_e;
    break;
  case 0xd:
    rhs_01.m_data = "OffsetFromUtc";
    rhs_01.m_size = 0xd;
    lhs_01.m_data = local_48.d.ptr;
    lhs_01.m_size = local_48.d.size;
    bVar1 = QtPrivate::equalStrings(lhs_01,rhs_01);
    if (!bVar1) {
      if (qVar7 == 0x14) goto switchD_00359bf6_caseD_14;
      if (qVar7 == 0xe) goto switchD_00359bf6_caseD_e;
      if (qVar7 == 0xc) goto switchD_00359bf6_caseD_c;
      break;
    }
    local_4c = -0x55555556;
    local_68.d = (QTimeZonePrivate *)0x0;
    uStack_60 = 0;
    local_58 = 0;
    local_88.d = (QTimeZonePrivate *)0x0;
    uStack_80 = 0;
    local_78 = 0;
    local_8c = -0x55555556;
    local_a8.d.d = (Data *)0x0;
    local_a8.d.ptr = (char16_t *)0x0;
    local_a8.d.size = 0;
    pQVar4 = operator>>(ds,&local_48);
    pQVar4 = QDataStream::operator>>(pQVar4,&local_4c);
    pQVar4 = operator>>(pQVar4,(QString *)&local_68.s);
    pQVar4 = operator>>(pQVar4,(QString *)&local_88.s);
    pQVar4 = QDataStream::operator>>(pQVar4,&local_8c);
    operator>>(pQVar4,&local_a8);
    QString::toUtf8_helper(&local_c8,&local_48);
    QTimeZone::QTimeZone((QTimeZone *)&local_b0.s,&local_c8);
    DVar5.s = *(ShortData *)&tz->d;
    tz->d = local_b0;
    local_b0.s = DVar5.s;
    QTimeZone::~QTimeZone((QTimeZone *)&local_b0.s);
    if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (((((ulong)tz->d & 3) == 0) &&
        (((tz->d).d == (QTimeZonePrivate *)0x0 ||
         (bVar1 = QTimeZonePrivate::isValid((tz->d).d), !bVar1)))) ||
       (bVar1 = QTimeZone::hasDaylightTime(tz), bVar1)) {
      bVar8 = true;
      bVar1 = false;
    }
    else {
      local_d0 = (Data)0x2;
      QDateTime::fromMSecsSinceEpoch((QDateTime *)&local_b0.s,0,(QTimeZone *)&local_d0.s);
      iVar2 = QTimeZone::offsetFromUtc(tz,(QDateTime *)&local_b0.s);
      bVar8 = iVar2 != local_4c;
      bVar1 = true;
    }
    if (bVar1) {
      QDateTime::~QDateTime((QDateTime *)&local_b0.s);
      QTimeZone::~QTimeZone((QTimeZone *)&local_d0.s);
    }
    if (bVar8) {
      QString::toUtf8_helper(&local_c8,&local_48);
      QTimeZone::QTimeZone
                ((QTimeZone *)&local_d8.s,&local_c8,local_4c,(QString *)&local_68.s,
                 (QString *)&local_88.s,(Territory)local_8c,&local_a8);
      DVar5.s = *(ShortData *)&tz->d;
      tz->d = local_d8;
      local_d8.s = DVar5.s;
      QTimeZone::~QTimeZone((QTimeZone *)&local_d8.s);
      if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,1,0x10);
        }
      }
    }
    if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (local_88.d != (QTimeZonePrivate *)0x0) {
      LOCK();
      *(int *)&(local_88.d)->_vptr_QTimeZonePrivate =
           *(int *)&(local_88.d)->_vptr_QTimeZonePrivate + -1;
      UNLOCK();
      if (*(int *)&(local_88.d)->_vptr_QTimeZonePrivate == 0) {
        QArrayData::deallocate((QArrayData *)local_88.d,2,0x10);
      }
    }
    if (local_68.d == (QTimeZonePrivate *)0x0) goto LAB_00359e41;
    LOCK();
    *(int *)&(local_68.d)->_vptr_QTimeZonePrivate =
         *(int *)&(local_68.d)->_vptr_QTimeZonePrivate + -1;
    UNLOCK();
    if (*(int *)&(local_68.d)->_vptr_QTimeZonePrivate != 0) goto LAB_00359e41;
    qVar7 = 2;
    goto LAB_00359ef6;
  case 0xe:
switchD_00359bf6_caseD_e:
    rhs_02.m_data = "QTimeZone::UTC";
    rhs_02.m_size = 0xe;
    lhs_02.m_data = local_48.d.ptr;
    lhs_02.m_size = qVar7;
    bVar1 = QtPrivate::equalStrings(lhs_02,rhs_02);
    if (bVar1) {
      DVar5 = (Data)0x2;
      goto LAB_00359e28;
    }
    if (qVar7 == 0x14) goto switchD_00359bf6_caseD_14;
    break;
  case 0x14:
switchD_00359bf6_caseD_14:
    rhs_03.m_data = "QTimeZone::LocalTime";
    rhs_03.m_size = 0x14;
    lhs_03.m_data = local_48.d.ptr;
    lhs_03.m_size = qVar7;
    bVar1 = QtPrivate::equalStrings(lhs_03,rhs_03);
    if (bVar1) {
      DVar5 = (Data)0x1;
LAB_00359e28:
      local_68.s = *(ShortData *)&tz->d;
      tz->d = DVar5;
      goto LAB_00359e3c;
    }
  }
  QString::toUtf8_helper((QByteArray *)&local_68.s,&local_48);
  QTimeZone::QTimeZone((QTimeZone *)&local_88.s,(QByteArray *)&local_68.s);
  DVar5.s = *(ShortData *)&tz->d;
  tz->d = local_88;
  local_88.s = DVar5.s;
  QTimeZone::~QTimeZone((QTimeZone *)&local_88.s);
  if (local_68.d != (QTimeZonePrivate *)0x0) {
    LOCK();
    *(int *)&(local_68.d)->_vptr_QTimeZonePrivate =
         *(int *)&(local_68.d)->_vptr_QTimeZonePrivate + -1;
    UNLOCK();
    if (*(int *)&(local_68.d)->_vptr_QTimeZonePrivate == 0) {
      qVar7 = 1;
LAB_00359ef6:
      QArrayData::deallocate((QArrayData *)local_68.d,qVar7,0x10);
    }
  }
LAB_00359e41:
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return ds;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &ds, QTimeZone &tz)
{
    QString ianaId;
    ds >> ianaId;
    // That may be various things other than actual IANA IDs:
    if (ianaId == invalidId()) {
        tz = QTimeZone();
    } else if (ianaId == "OffsetFromUtc"_L1) {
        int utcOffset;
        QString name;
        QString abbreviation;
        int territory;
        QString comment;
        ds >> ianaId >> utcOffset >> name >> abbreviation >> territory >> comment;
#if QT_CONFIG(timezone)
        // Try creating as a system timezone, which succeeds (producing a valid
        // zone) iff ianaId is valid; use this if it is a plain offset from UTC
        // zone, with the right offset, ignoring the other data:
        tz = QTimeZone(ianaId.toUtf8());
        if (!tz.isValid() || tz.hasDaylightTime()
            || tz.offsetFromUtc(QDateTime::fromMSecsSinceEpoch(0, QTimeZone::UTC)) != utcOffset) {
            // Construct a custom timezone using the saved values:
            tz = QTimeZone(ianaId.toUtf8(), utcOffset, name, abbreviation,
                           QLocale::Territory(territory), comment);
        }
#else
        tz = QTimeZone::fromSecondsAheadOfUtc(utcOffset);
#endif
    } else if (ianaId == "AheadOfUtcBy"_L1) {
        int utcOffset;
        ds >> utcOffset;
        tz = QTimeZone::fromSecondsAheadOfUtc(utcOffset);
    } else if (ianaId == "QTimeZone::UTC"_L1) {
        tz = QTimeZone(QTimeZone::UTC);
    } else if (ianaId == "QTimeZone::LocalTime"_L1) {
        tz = QTimeZone(QTimeZone::LocalTime);
#if QT_CONFIG(timezone)
    } else {
        tz = QTimeZone(ianaId.toUtf8());
#endif
    }
    return ds;
}